

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom(AnyMetadata *this,Message *message)

{
  size_t sVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen("type.googleapis.com/");
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"type.googleapis.com/","type.googleapis.com/" + sVar1);
  PackFrom(this,message,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message) {
  PackFrom(message, kTypeGoogleApisComPrefix);
}